

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

string * __thiscall
google::protobuf::internal::ExtensionSet::GetString
          (ExtensionSet *this,int number,string *default_value)

{
  Extension *pEVar1;
  
  pEVar1 = FindOrNull(this,number);
  if ((pEVar1 != (Extension *)0x0) && ((pEVar1->field_0xa & 1) == 0)) {
    default_value = (string *)(pEVar1->field_0).int64_value;
  }
  return default_value;
}

Assistant:

const std::string& ExtensionSet::GetString(
    int number, const std::string& default_value) const {
  const Extension* extension = FindOrNull(number);
  if (extension == NULL || extension->is_cleared) {
    // Not present.  Return the default value.
    return default_value;
  } else {
    GOOGLE_DCHECK_TYPE(*extension, OPTIONAL_FIELD, STRING);
    return *extension->string_value;
  }
}